

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O2

void __thiscall BindingEnv::AddRule(BindingEnv *this,Rule *rule)

{
  Rule *pRVar1;
  mapped_type *ppRVar2;
  
  pRVar1 = LookupRuleCurrentScope(this,&rule->name_);
  if (pRVar1 == (Rule *)0x0) {
    ppRVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
              ::operator[](&this->rules_,&rule->name_);
    *ppRVar2 = rule;
    return;
  }
  __assert_fail("LookupRuleCurrentScope(rule->name()) == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/eval_env.cc",
                0x23,"void BindingEnv::AddRule(const Rule *)");
}

Assistant:

void BindingEnv::AddRule(const Rule* rule) {
  assert(LookupRuleCurrentScope(rule->name()) == NULL);
  rules_[rule->name()] = rule;
}